

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O2

void __thiscall
flatbuffers::FlatBufferBuilder::TrackField(FlatBufferBuilder *this,voffset_t field,uoffset_t off)

{
  undefined8 in_RAX;
  FieldLoc fl;
  value_type local_8;
  
  local_8._6_2_ = SUB82((ulong)in_RAX >> 0x30,0);
  local_8.id = field;
  local_8.off = off;
  std::
  vector<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
  ::push_back(&this->offsetbuf_,&local_8);
  return;
}

Assistant:

void TrackField(voffset_t field, uoffset_t off) {
    FieldLoc fl = { off, field };
    offsetbuf_.push_back(fl);
  }